

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue str2;
  JSValue val_00;
  JSValue v_02;
  int iVar1;
  undefined4 in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  JSValue JVar2;
  JSAtom in_stack_0000005c;
  JSObject *p;
  JSAtom atom;
  int is_array;
  JSValue tag;
  JSValue obj;
  BOOL in_stack_00000100;
  undefined4 in_stack_ffffffffffffff08;
  JSAtom in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  JSValueUnion in_stack_ffffffffffffff18;
  JSContext *in_stack_ffffffffffffff20;
  JSValueUnion local_c8;
  char *local_b8;
  JSValue in_stack_ffffffffffffff58;
  JSValueUnion in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffffa0;
  JSValueUnion local_40;
  int64_t local_38;
  
  JVar2.tag = in_RDX;
  JVar2.u.ptr = in_RSI.ptr;
  iVar1 = JS_IsNull(JVar2);
  if (iVar1 == 0) {
    v_02.tag = in_RDX;
    v_02.u.ptr = in_RSI.ptr;
    iVar1 = JS_IsUndefined(v_02);
    if (iVar1 == 0) {
      val_00.tag = (int64_t)in_RSI.ptr;
      val_00.u.ptr = in_RDI.ptr;
      JVar2 = JS_ToObject((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),val_00);
      local_c8 = JVar2.u;
      iVar1 = JS_IsException(JVar2);
      if (iVar1 != 0) {
        return JVar2;
      }
      val.u._4_4_ = in_stack_ffffffffffffff14;
      val.u.int32 = in_stack_ffffffffffffff10;
      val.tag = (int64_t)in_stack_ffffffffffffff18.ptr;
      in_stack_ffffffffffffff74 =
           JS_IsArray((JSContext *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),val
                     );
      if (in_stack_ffffffffffffff74 < 0) {
        v.tag = (int64_t)in_stack_ffffffffffffff20;
        v.u.ptr = in_stack_ffffffffffffff18.ptr;
        JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),v);
        local_40.ptr = (void *)(local_40 << 0x20);
        local_38 = 6;
        return _local_40;
      }
      if (in_stack_ffffffffffffff74 == 0) {
        iVar1 = JS_IsFunction((JSContext *)in_RDI.ptr,JVar2);
        if (iVar1 == 0) {
          in_stack_ffffffffffffff14 = (uint)*(ushort *)((long)local_c8.ptr + 6);
          in_stack_ffffffffffffff68 = local_c8;
          if (((in_stack_ffffffffffffff14 - 3 < 4) || (in_stack_ffffffffffffff14 - 8 < 3)) ||
             (in_stack_ffffffffffffff14 == 0x12)) {
            in_stack_ffffffffffffff70 =
                 *(undefined4 *)
                  (*(long *)(*(long *)((long)in_RDI.ptr + 0x18) + 0x70) +
                   (ulong)*(ushort *)((long)local_c8.ptr + 6) * 0x28 + 4);
          }
          else {
            in_stack_ffffffffffffff70 = 0x8f;
          }
        }
        else {
          in_stack_ffffffffffffff70 = 0x9a;
        }
      }
      else {
        in_stack_ffffffffffffff70 = 0x90;
      }
      JVar2 = JS_GetPropertyInternal
                        ((JSContext *)p,stack0x00000078,in_stack_0000005c,(JSValue)_atom,
                         in_stack_00000100);
      v_00.tag = (int64_t)in_stack_ffffffffffffff20;
      v_00.u.ptr = in_stack_ffffffffffffff18.ptr;
      JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),v_00);
      iVar1 = JS_IsException(JVar2);
      if (iVar1 != 0) {
        local_40.ptr = (void *)(local_40 << 0x20);
        local_38 = 6;
        return _local_40;
      }
      iVar1 = JS_IsString(JVar2);
      if (iVar1 == 0) {
        v_01.tag = (int64_t)in_stack_ffffffffffffff20;
        v_01.u.ptr = in_stack_ffffffffffffff18.ptr;
        JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),v_01
                    );
        JS_AtomToString((JSContext *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff0c);
      }
    }
    else {
      JVar2 = JS_NewString(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18.ptr);
      local_b8 = (char *)JVar2.tag;
    }
  }
  else {
    in_stack_ffffffffffffff58 =
         JS_NewString(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18.ptr);
  }
  str2.tag._0_4_ = in_stack_ffffffffffffff70;
  str2.u.float64 = in_stack_ffffffffffffff68.float64;
  str2.tag._4_4_ = in_stack_ffffffffffffff74;
  JVar2 = JS_ConcatString3((JSContext *)in_stack_ffffffffffffff58.tag,
                           (char *)in_stack_ffffffffffffff58.u.ptr,str2,local_b8);
  return JVar2;
}

Assistant:

static JSValue js_object_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValue obj, tag;
    int is_array;
    JSAtom atom;
    JSObject *p;

    if (JS_IsNull(this_val)) {
        tag = JS_NewString(ctx, "Null");
    } else if (JS_IsUndefined(this_val)) {
        tag = JS_NewString(ctx, "Undefined");
    } else {
        obj = JS_ToObject(ctx, this_val);
        if (JS_IsException(obj))
            return obj;
        is_array = JS_IsArray(ctx, obj);
        if (is_array < 0) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
        if (is_array) {
            atom = JS_ATOM_Array;
        } else if (JS_IsFunction(ctx, obj)) {
            atom = JS_ATOM_Function;
        } else {
            p = JS_VALUE_GET_OBJ(obj);
            switch(p->class_id) {
            case JS_CLASS_STRING:
            case JS_CLASS_ARGUMENTS:
            case JS_CLASS_MAPPED_ARGUMENTS:
            case JS_CLASS_ERROR:
            case JS_CLASS_BOOLEAN:
            case JS_CLASS_NUMBER:
            case JS_CLASS_DATE:
            case JS_CLASS_REGEXP:
                atom = ctx->rt->class_array[p->class_id].class_name;
                break;
            default:
                atom = JS_ATOM_Object;
                break;
            }
        }
        tag = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_toStringTag);
        JS_FreeValue(ctx, obj);
        if (JS_IsException(tag))
            return JS_EXCEPTION;
        if (!JS_IsString(tag)) {
            JS_FreeValue(ctx, tag);
            tag = JS_AtomToString(ctx, atom);
        }
    }
    return JS_ConcatString3(ctx, "[object ", tag, "]");
}